

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_merger.cpp
# Opt level: O1

void __thiscall duckdb::ARTMerger::MergeInlined(ARTMerger *this,NodeEntry *entry)

{
  GateStatus GVar1;
  uint8_t byte;
  uint8_t byte_00;
  ulong uVar2;
  idx_t node_00;
  data_ptr_t pdVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  UNSIGNED bytes;
  reference<Node> node;
  ARTKey left_key;
  ARTKey local_58;
  ulong local_48;
  ARTKey local_40;
  
  GVar1 = entry->status;
  if (GVar1 == GATE_NOT_SET) {
    entry->depth = 0;
  }
  uVar5 = (entry->left->super_IndexPointer).data;
  uVar2 = (entry->right->super_IndexPointer).data;
  puVar4 = (ulong *)ArenaAllocator::Allocate(&this->arena,8);
  *puVar4 = (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
            (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
            (uVar5 & 0xff00) << 0x28 | (uVar5 & 0xffffffffffffff) << 0x38;
  *(data_t *)puVar4 = 0x80;
  local_48 = uVar5 & 0xffffffffffffff;
  ARTKey::ARTKey(&local_58,(data_ptr_t)puVar4,8);
  pdVar3 = local_58.data;
  local_40.len = local_58.len;
  local_40.data = local_58.data;
  puVar4 = (ulong *)ArenaAllocator::Allocate(&this->arena,8);
  *puVar4 = (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
            (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
            (uVar2 & 0xff00) << 0x28 | (uVar2 & 0xffffffffffffff) << 0x38;
  *(data_t *)puVar4 = 0x80;
  ARTKey::ARTKey(&local_58,(data_ptr_t)puVar4,8);
  uVar5 = entry->depth;
  uVar6 = uVar5;
  uVar7 = 0xffffffffffffffff;
  if (uVar5 < local_58.len) {
    do {
      uVar7 = uVar6;
      if (pdVar3[uVar6] != local_58.data[uVar6]) break;
      uVar6 = uVar6 + 1;
      uVar7 = 0xffffffffffffffff;
    } while (local_58.len != uVar6);
  }
  local_58.len = (idx_t)entry->left;
  (((Node *)local_58.len)->super_IndexPointer).data = 0;
  if (uVar7 - uVar5 != 0) {
    Prefix::New(this->art,(reference<Node> *)&local_58,&local_40,uVar5,uVar7 - uVar5);
  }
  node_00 = local_58.len;
  byte = pdVar3[uVar7];
  byte_00 = local_58.data[uVar7];
  if (uVar7 == 7) {
    BaseLeaf<(unsigned_char)'\a',_(duckdb::NType)8>::New(this->art,(Node *)local_58.len);
    Node7Leaf::InsertByte(this->art,(Node *)node_00,byte);
    Node7Leaf::InsertByte(this->art,(Node *)node_00,byte_00);
  }
  else {
    BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New(this->art,(Node *)local_58.len);
    Node4::InsertChild(this->art,(Node *)node_00,byte,(Node)(local_48 | 0x700000000000000));
    Node4::InsertChild(this->art,(Node *)node_00,byte_00,
                       (Node)(uVar2 & 0xffffffffffffff | 0x700000000000000));
  }
  uVar5 = (entry->left->super_IndexPointer).data;
  if (GVar1 == GATE_NOT_SET) {
    uVar5 = uVar5 | 0x8000000000000000;
  }
  else {
    uVar5 = uVar5 & 0x7fffffffffffffff;
  }
  (entry->left->super_IndexPointer).data = uVar5;
  return;
}

Assistant:

void ARTMerger::MergeInlined(NodeEntry &entry) {
	D_ASSERT(entry.left.GetType() == NType::LEAF_INLINED);
	D_ASSERT(entry.right.GetType() == NType::LEAF_INLINED);

	auto new_status = GateStatus::GATE_NOT_SET;
	if (entry.status == GateStatus::GATE_NOT_SET) {
		// Case 1: We are outside a nested leaf,
		// so we create a nested leaf.
		new_status = GateStatus::GATE_SET;
		entry.depth = 0;
	}
	// Otherwise, case 2: we are in a nested leaf with two 'compressed' prefixes.
	// A 'compressed prefix' is an inlined leaf that could've been expanded to
	// a prefix with an inlined leaf as its only child.

	// Get the corresponding row IDs and their ART keys.
	auto left_row_id = entry.left.GetRowId();
	auto right_row_id = entry.right.GetRowId();
	auto left_key = ARTKey::CreateARTKey<row_t>(arena, left_row_id);
	auto right_key = ARTKey::CreateARTKey<row_t>(arena, right_row_id);

	auto pos = left_key.GetMismatchPos(right_key, entry.depth);

	entry.left.Clear();
	reference<Node> node(entry.left);
	if (pos != entry.depth) {
		// The row IDs share a prefix.
		Prefix::New(art, node, left_key, entry.depth, pos - entry.depth);
	}

	auto left_byte = left_key.data[pos];
	auto right_byte = right_key.data[pos];

	if (pos == Prefix::ROW_ID_COUNT) {
		// The row IDs differ on the last byte.
		Node7Leaf::New(art, node);
		Node7Leaf::InsertByte(art, node, left_byte);
		Node7Leaf::InsertByte(art, node, right_byte);
		entry.left.SetGateStatus(new_status);
		return;
	}

	// Create and insert the (compressed) children.
	// We inline directly into the node, instead of creating prefixes
	// with a single inlined leaf as their child.
	Node4::New(art, node);

	Node left_child;
	Leaf::New(left_child, left_row_id);
	Node4::InsertChild(art, node, left_byte, left_child);

	Node right_child;
	Leaf::New(right_child, right_row_id);
	Node4::InsertChild(art, node, right_byte, right_child);

	entry.left.SetGateStatus(new_status);
}